

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalInsert::Sink
          (PhysicalInsert *this,ExecutionContext *context,DataChunk *insert_chunk,
          OperatorSinkInput *input)

{
  DataChunk *tuples;
  InsertGlobalState *pIVar1;
  DuckTableEntry *pDVar2;
  InsertLocalState *pIVar3;
  pthread_mutex_t *context_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  shared_ptr<duckdb::DataTableInfo,_true> *psVar7;
  idx_t iVar8;
  undefined4 extraout_var_01;
  TableIOManager *args_1;
  pointer pRVar9;
  OptimisticDataWriter *this_00;
  PhysicalIndex PVar10;
  RowGroupCollection *this_01;
  pointer this_02;
  pointer *__ptr;
  templated_unique_single_t collection;
  shared_ptr<duckdb::DataTableInfo,_true> table_info;
  unsigned_long max_row_id;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_78;
  InsertLocalState *local_70;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_68;
  pthread_mutex_t *local_60;
  DuckTableEntry *local_58;
  InsertGlobalState *local_50;
  shared_ptr<duckdb::DataTableInfo,_true> local_48;
  unsigned_long local_38;
  DataTable *table;
  
  pIVar1 = (InsertGlobalState *)input->global_state;
  local_70 = (InsertLocalState *)input->local_state;
  pDVar2 = pIVar1->table;
  iVar5 = (*(pDVar2->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(pDVar2);
  DataChunk::Flatten(insert_chunk);
  local_58 = pDVar2;
  if (this->parallel == false) {
    local_60 = (pthread_mutex_t *)context;
    iVar8 = OnConflictHandling(this,&pDVar2->super_TableCatalogEntry,context,pIVar1,local_70,
                               insert_chunk);
    pIVar1->insert_count = pIVar1->insert_count + iVar8 + insert_chunk->count;
    local_50 = pIVar1;
    if (this->return_chunk == true) {
      ColumnDataCollection::Append(&pIVar1->return_collection,insert_chunk);
    }
    pDVar2 = local_58;
    DataTable::LocalAppend
              ((DataTable *)CONCAT44(extraout_var,iVar5),&local_58->super_TableCatalogEntry,
               *(ClientContext **)local_60,insert_chunk,&this->bound_constraints);
    pIVar1 = local_50;
    context_00 = local_60;
    pIVar3 = local_70;
    if ((this->action_type == UPDATE) && ((local_70->update_chunk).count != 0)) {
      tuples = &local_70->update_chunk;
      HandleInsertConflicts<true>
                (&pDVar2->super_TableCatalogEntry,(ExecutionContext *)local_60,local_70,local_50,
                 tuples,this);
      HandleInsertConflicts<false>
                (&pDVar2->super_TableCatalogEntry,(ExecutionContext *)context_00,pIVar3,pIVar1,
                 tuples,this);
    }
  }
  else {
    iVar6 = (*(pIVar1->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])();
    table = (DataTable *)CONCAT44(extraout_var_00,iVar6);
    if ((local_70->collection_index).index == 0xffffffffffffffff) {
      psVar7 = DataTable::GetDataTableInfo((DataTable *)CONCAT44(extraout_var,iVar5));
      local_48.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (psVar7->internal).
             super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (psVar7->internal).super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_48.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_48.internal.
                super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_48.internal.
                super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      iVar5 = (*(local_58->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                super_CatalogEntry._vptr_CatalogEntry[0x10])();
      args_1 = TableIOManager::Get((DataTable *)CONCAT44(extraout_var_01,iVar5));
      local_38 = NumericCastImpl<unsigned_long,_long,_false>::Convert(0x7ffffffffff080);
      make_uniq<duckdb::RowGroupCollection,duckdb::shared_ptr<duckdb::DataTableInfo,true>,duckdb::TableIOManager&,duckdb::vector<duckdb::LogicalType,true>const&,unsigned_long&>
                ((duckdb *)&local_78,&local_48,args_1,&this->insert_types,&local_38);
      pRVar9 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
               ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                             *)&local_78);
      RowGroupCollection::InitializeEmpty(pRVar9);
      pRVar9 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
               ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                             *)&local_78);
      RowGroupCollection::InitializeAppend(pRVar9,&local_70->local_append_state);
      local_60 = (pthread_mutex_t *)&pIVar1->lock;
      iVar5 = pthread_mutex_lock(local_60);
      if (iVar5 != 0) {
        ::std::__throw_system_error(iVar5);
      }
      this_00 = (OptimisticDataWriter *)operator_new(0x10);
      OptimisticDataWriter::OptimisticDataWriter(this_00,table);
      ::std::
      __uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
      ::reset((__uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
               *)&local_70->optimistic_writer,this_00);
      local_68._M_head_impl = local_78._M_head_impl;
      local_78._M_head_impl = (RowGroupCollection *)0x0;
      PVar10 = DataTable::CreateOptimisticCollection
                         (table,context->client,
                          (unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                           *)&local_68);
      (local_70->collection_index).index = PVar10.index;
      if (local_68._M_head_impl != (RowGroupCollection *)0x0) {
        ::std::default_delete<duckdb::RowGroupCollection>::operator()
                  ((default_delete<duckdb::RowGroupCollection> *)&local_68,local_68._M_head_impl);
      }
      local_68._M_head_impl = (RowGroupCollection *)0x0;
      pthread_mutex_unlock(local_60);
      if (local_78._M_head_impl != (RowGroupCollection *)0x0) {
        ::std::default_delete<duckdb::RowGroupCollection>::operator()
                  ((default_delete<duckdb::RowGroupCollection> *)&local_78,local_78._M_head_impl);
      }
      if (local_48.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.internal.
                   super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    pIVar3 = local_70;
    OnConflictHandling(this,&local_58->super_TableCatalogEntry,context,pIVar1,local_70,insert_chunk)
    ;
    this_01 = DataTable::GetOptimisticCollection
                        (table,context->client,(PhysicalIndex)(pIVar3->collection_index).index);
    bVar4 = RowGroupCollection::Append(this_01,insert_chunk,&pIVar3->local_append_state);
    if (bVar4) {
      this_02 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                ::operator->(&pIVar3->optimistic_writer);
      OptimisticDataWriter::WriteNewRowGroup(this_02,this_01);
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalInsert::Sink(ExecutionContext &context, DataChunk &insert_chunk,
                                    OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<InsertGlobalState>();
	auto &lstate = input.local_state.Cast<InsertLocalState>();

	auto &table = gstate.table;
	auto &storage = table.GetStorage();
	insert_chunk.Flatten();

	if (!parallel) {
		idx_t updated_tuples = OnConflictHandling(table, context, gstate, lstate, insert_chunk);

		gstate.insert_count += insert_chunk.size();
		gstate.insert_count += updated_tuples;
		if (return_chunk) {
			gstate.return_collection.Append(insert_chunk);
		}
		storage.LocalAppend(table, context.client, insert_chunk, bound_constraints);
		if (action_type == OnConflictAction::UPDATE && lstate.update_chunk.size() != 0) {
			(void)HandleInsertConflicts<true>(table, context, lstate, gstate, lstate.update_chunk, *this);
			(void)HandleInsertConflicts<false>(table, context, lstate, gstate, lstate.update_chunk, *this);
			// All of the tuples should have been turned into an update, leaving the chunk empty afterwards
			D_ASSERT(lstate.update_chunk.size() == 0);
		}
		return SinkResultType::NEED_MORE_INPUT;
	}

	// Parallel append.
	D_ASSERT(!return_chunk);
	auto &data_table = gstate.table.GetStorage();
	if (!lstate.collection_index.IsValid()) {
		auto table_info = storage.GetDataTableInfo();
		auto &io_manager = TableIOManager::Get(table.GetStorage());

		// Create the local row group collection.
		auto max_row_id = NumericCast<idx_t>(MAX_ROW_ID);
		auto collection = make_uniq<RowGroupCollection>(std::move(table_info), io_manager, insert_types, max_row_id);
		collection->InitializeEmpty();
		collection->InitializeAppend(lstate.local_append_state);

		lock_guard<mutex> l(gstate.lock);
		lstate.optimistic_writer = make_uniq<OptimisticDataWriter>(data_table);
		lstate.collection_index = data_table.CreateOptimisticCollection(context.client, std::move(collection));
	}

	OnConflictHandling(table, context, gstate, lstate, insert_chunk);
	D_ASSERT(action_type != OnConflictAction::UPDATE);

	auto &collection = data_table.GetOptimisticCollection(context.client, lstate.collection_index);
	auto new_row_group = collection.Append(insert_chunk, lstate.local_append_state);
	if (new_row_group) {
		lstate.optimistic_writer->WriteNewRowGroup(collection);
	}
	return SinkResultType::NEED_MORE_INPUT;
}